

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerSweepManager.cpp
# Opt level: O1

bool __thiscall Memory::RecyclerSweepManager::AdjustPartialHeuristics(RecyclerSweepManager *this)

{
  undefined4 *puVar1;
  Recycler *pRVar2;
  code *pcVar3;
  bool bVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *in_FS_OFFSET;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  
  if (this->recycler->inPartialCollectMode == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x19f,"(recycler->inPartialCollectMode)","recycler->inPartialCollectMode");
    if (!bVar4) goto LAB_0028bc89;
    *puVar1 = 0;
  }
  if (this->adjustPartialHeuristics == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a0,"(this->adjustPartialHeuristics)","this->adjustPartialHeuristics");
    if (!bVar4) goto LAB_0028bc89;
    *puVar1 = 0;
  }
  if ((this->inPartialCollect == false) &&
     ((this->recycler->autoHeap).unusedPartialCollectFreeBytes != 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a1,
                       "(this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0)"
                       ,
                       "this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0"
                      );
    if (!bVar4) goto LAB_0028bc89;
    *puVar1 = 0;
  }
  if (0x500000 < this->rescanRootBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a4,"(this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes)",
                       "this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes");
    if (!bVar4) goto LAB_0028bc89;
    *puVar1 = 0;
  }
  if (0x1000000 < (this->recycler->autoHeap).unusedPartialCollectFreeBytes) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1a5,
                       "(recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes)"
                       ,
                       "recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes"
                      );
    if (!bVar4) goto LAB_0028bc89;
    *puVar1 = 0;
  }
  sVar5 = GetNewObjectAllocBytes(this);
  if (sVar5 == 0) {
    this->partialCollectSmallHeapBlockReuseMinFreeBytes = 0;
    dVar10 = 1.0;
  }
  else {
    sVar6 = GetNewObjectFreeBytes(this);
    if (sVar5 < sVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                         ,0x1b3,"(freedBytes <= allocBytes)","freedBytes <= allocBytes");
      if (!bVar4) goto LAB_0028bc89;
      *puVar1 = 0;
    }
    auVar13._8_4_ = (int)(sVar6 >> 0x20);
    auVar13._0_8_ = sVar6;
    auVar13._12_4_ = 0x45300000;
    auVar11._8_4_ = (int)(sVar5 >> 0x20);
    auVar11._0_8_ = sVar5;
    auVar11._12_4_ = 0x45300000;
    dVar12 = (((double)CONCAT44(0x43300000,(int)sVar6) - 4503599627370496.0) +
             (auVar13._8_8_ - 1.9342813113834067e+25)) /
             (((double)CONCAT44(0x43300000,(int)sVar5) - 4503599627370496.0) +
             (auVar11._8_8_ - 1.9342813113834067e+25));
    dVar10 = dVar12;
    if (0.1 <= dVar12) {
      dVar10 = (dVar12 + -0.1) / 0.9;
      if (1.0 < dVar10) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar1 = (undefined4 *)*in_FS_OFFSET;
        *puVar1 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                           ,0x1c4,"(collectEfficacy <= 1.0)","collectEfficacy <= 1.0");
        if (!bVar4) goto LAB_0028bc89;
        *puVar1 = 0;
      }
      uVar7 = (ulong)(dVar10 * 4096.0);
      this->partialCollectSmallHeapBlockReuseMinFreeBytes =
           (long)(dVar10 * 4096.0 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7;
    }
    if (dVar12 < 0.1) {
      return false;
    }
  }
  pRVar2 = this->recycler;
  (pRVar2->collectionStats).collectEfficacy = dVar10;
  (pRVar2->collectionStats).partialCollectSmallHeapBlockReuseMinFreeBytes =
       this->partialCollectSmallHeapBlockReuseMinFreeBytes;
  dVar15 = 1.0 - dVar10;
  dVar12 = (((double)CONCAT44(0x43300000,(int)this->reuseHeapBlockCount) - 4503599627370496.0) +
           ((double)CONCAT44(0x45300000,(int)(this->reuseHeapBlockCount >> 0x20)) -
           1.9342813113834067e+25)) * dVar15;
  uVar7 = (ulong)dVar12;
  uVar9 = ((long)(dVar12 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) * 0x1000;
  uVar7 = this->rescanRootBytes;
  if (this->rescanRootBytes <= uVar9) {
    uVar7 = uVar9;
  }
  (pRVar2->collectionStats).estimatedPartialReuseBytes = uVar9;
  if (0x500000 < uVar7) {
    return false;
  }
  (pRVar2->collectionStats).collectCost = (double)(long)uVar7 / 5242880.0;
  dVar10 = ((double)(long)uVar7 / 5242880.0) * dVar10 + dVar15;
  if (this->inPartialCollect == true) {
    if ((ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect <
        this->nextPartialUncollectedAllocBytes) {
      return false;
    }
    sVar5 = (pRVar2->autoHeap).unusedPartialCollectFreeBytes;
    auVar14._0_8_ = (double)CONCAT44(0x43300000,(int)sVar5);
    auVar14._8_4_ = (int)(sVar5 >> 0x20);
    auVar14._12_4_ = 0x45300000;
    dVar12 = (double)(long)this->nextPartialUncollectedAllocBytes /
             (double)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
    dVar12 = (1.0 - dVar12) *
             ((auVar14._0_8_ - 4503599627370496.0) + (auVar14._8_8_ - 1.9342813113834067e+25)) *
             5.9604644775390625e-08 + dVar12;
    dVar10 = dVar10 * (1.0 - dVar12) + dVar12;
  }
  if ((dVar10 < 0.0) || (1.0 < dVar10)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1f7,"(0.0 <= ratio && ratio <= 1.0)","0.0 <= ratio && ratio <= 1.0");
    if (!bVar4) goto LAB_0028bc89;
    *puVar1 = 0;
  }
  uVar9 = (ulong)RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount;
  dVar12 = (double)(RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount - 0x400) * dVar10;
  uVar8 = (ulong)dVar12;
  uVar8 = (long)(dVar12 - 9.223372036854776e+18) & (long)uVar8 >> 0x3f | uVar8;
  uVar7 = uVar8 + 0x400;
  this->recycler->uncollectedNewPageCountPartialCollect = uVar7;
  if (0xfffffffffffffbff < uVar8 || uVar9 < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerSweepManager.cpp"
                       ,0x1fe,
                       "(recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount && recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount)"
                       ,
                       "recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount && recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount"
                      );
    if (!bVar4) {
LAB_0028bc89:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar1 = 0;
  }
  dVar15 = dVar15 * (((double)CONCAT44(0x43300000,(int)this->reuseByteCount) - 4503599627370496.0) +
                    ((double)CONCAT44(0x45300000,(int)(this->reuseByteCount >> 0x20)) -
                    1.9342813113834067e+25));
  uVar7 = (ulong)dVar15;
  bVar4 = this->recycler->uncollectedNewPageCountPartialCollect * 0x1000 +
          this->nextPartialUncollectedAllocBytes +
          ((long)(dVar15 - 9.223372036854776e+18) & (long)uVar7 >> 0x3f | uVar7) <
          (ulong)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
  if (bVar4) {
    bVar4 = RecyclerHeuristic::PartialConcurrentNextCollection
                      (dVar10,this->recycler->recyclerFlagsTable);
    this->recycler->partialConcurrentNextCollection = bVar4;
    return true;
  }
  return bVar4;
}

Assistant:

bool
RecyclerSweepManager::AdjustPartialHeuristics()
{
    Assert(recycler->inPartialCollectMode);
    Assert(this->adjustPartialHeuristics);
    Assert(this->InPartialCollect() || recycler->autoHeap.unusedPartialCollectFreeBytes == 0);

    // DoPartialCollectMode should have rejected these already
    Assert(this->rescanRootBytes <= (size_t)MaxPartialCollectRescanRootBytes);
    Assert(recycler->autoHeap.unusedPartialCollectFreeBytes <= MaxUnusedPartialCollectFreeBytes);

    // Page reuse Heuristics
    double collectEfficacy;
    const size_t allocBytes = this->GetNewObjectAllocBytes();
    if (allocBytes == 0)
    {
        // We may get collections without allocating memory (e.g. unpin heuristics).
        collectEfficacy = 1.0;                                          // assume 100% efficacy
        this->partialCollectSmallHeapBlockReuseMinFreeBytes = 0;    // reuse all pages
    }
    else
    {
        const size_t freedBytes = this->GetNewObjectFreeBytes();
        Assert(freedBytes <= allocBytes);

        collectEfficacy = (double)freedBytes / (double)allocBytes;

        // If we collected less then 10% of the memory, let's not do partial GC.
        // CONSIDER: It may be good to do partial with low efficacy once we have concurrent partial
        // because old object are not getting collected as well, but without concurrent partial, we will have to mark
        // new objects in thread.
        if (collectEfficacy < MinPartialCollectEfficacy)
        {
            return false;
        }

        // Scale the efficacy linearly such that an efficacy of MinPartialCollectEfficacy translates to an adjusted efficacy of
        // 0.0, and an efficacy of 1.0 translates to an adjusted efficacy of 1.0
        collectEfficacy = (collectEfficacy - MinPartialCollectEfficacy) / (1.0 - MinPartialCollectEfficacy);

        Assert(collectEfficacy <= 1.0);
        this->partialCollectSmallHeapBlockReuseMinFreeBytes = (size_t)(AutoSystemInfo::PageSize * collectEfficacy);
    }
#ifdef RECYCLER_STATS
    recycler->collectionStats.collectEfficacy = collectEfficacy;
    recycler->collectionStats.partialCollectSmallHeapBlockReuseMinFreeBytes = this->partialCollectSmallHeapBlockReuseMinFreeBytes;
#endif

    // Blocks which are being reused are likely to be touched again from allocation and contribute to Rescan cost.
    // If there are many of these, adjust rescanRootBytes to account for this.
    const size_t estimatedPartialReuseBlocks = (size_t)((double)this->reuseHeapBlockCount * (1.0 - collectEfficacy));
    const size_t estimatedPartialReuseBytes = estimatedPartialReuseBlocks * AutoSystemInfo::PageSize;

    const size_t newRescanRootBytes = max(this->rescanRootBytes, estimatedPartialReuseBytes);

    RECYCLER_STATS_SET(recycler, estimatedPartialReuseBytes, estimatedPartialReuseBytes);

    // Recheck the rescanRootBytes
    if (newRescanRootBytes > MaxPartialCollectRescanRootBytes)
    {
        return false;
    }

    double collectCost = (double)newRescanRootBytes / MaxPartialCollectRescanRootBytes;

    RECYCLER_STATS_SET(recycler, collectCost, collectCost);

    // Include the efficacy in equal portion, which is related to the cost of marking through new objects.
    // r = c * e + 1 - e;
    const double reuseRatio = 1.0 - collectEfficacy;
    double ratio = collectCost * collectEfficacy + reuseRatio;

    if (this->InPartialCollect())
    {
        // Avoid ratio of uncollectedBytesPressure > 1.0
        if (this->nextPartialUncollectedAllocBytes > RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect)
        {
            return false;
        }

        // Only add full collect pressure if we are doing partial collect,
        // account for the amount of uncollected bytes and unused bytes to increase
        // pressure to do a full GC by rising the partial GC new page heuristic

        double uncollectedBytesPressure = (double)this->nextPartialUncollectedAllocBytes / (double)RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect;
        double collectFullCollectPressure =
            (double)recycler->autoHeap.unusedPartialCollectFreeBytes / (double)MaxUnusedPartialCollectFreeBytes
            * (1.0 - uncollectedBytesPressure) + uncollectedBytesPressure;

        ratio = ratio * (1.0 - collectFullCollectPressure) + collectFullCollectPressure;
    }
    Assert(0.0 <= ratio && ratio <= 1.0);

    // Linear scale the partial GC new page heuristic using the ratio calculated
    recycler->uncollectedNewPageCountPartialCollect = MinPartialUncollectedNewPageCount
        + (size_t)((double)(RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount - MinPartialUncollectedNewPageCount) * ratio);

    Assert(recycler->uncollectedNewPageCountPartialCollect >= MinPartialUncollectedNewPageCount &&
        recycler->uncollectedNewPageCountPartialCollect <= RecyclerHeuristic::Instance.MaxPartialUncollectedNewPageCount);

    // If the number of new page to reach the partial heuristics plus the existing uncollectedAllocBytes
    // and the memory we are going to reuse (assume we use it all) is greater then the full GC max size heuristic
    // (with 1M fudge factor), we trigger a full GC anyways, so let's not get into partial GC
    const size_t estimatedPartialReusedFreeByteCount = (size_t)((double)this->reuseByteCount * reuseRatio);
    if (recycler->uncollectedNewPageCountPartialCollect * AutoSystemInfo::PageSize
        + this->nextPartialUncollectedAllocBytes + estimatedPartialReusedFreeByteCount >= RecyclerHeuristic::Instance.MaxUncollectedAllocBytesPartialCollect)
    {
        return false;
    }

#if ENABLE_CONCURRENT_GC
    recycler->partialConcurrentNextCollection = RecyclerHeuristic::PartialConcurrentNextCollection(ratio, recycler->GetRecyclerFlagsTable());
#endif
    return true;
}